

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_trd.cpp
# Opt level: O2

bool TRD_AddFile(path *fname,char *fhobname,int start,int length,int autostart,bool replace,
                bool addplace,int lengthMinusVars)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  ETrdFileName EVar7;
  int iVar8;
  int iVar9;
  FILE *__stream;
  ulong uVar10;
  byte *pbVar11;
  char cVar12;
  uint uVar13;
  uint uVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  STrdFile *__s1;
  uint uVar18;
  char *pcVar19;
  STrdHead *this;
  ulong uVar20;
  ulong __off;
  uint fatIndex;
  long lVar21;
  byte local_9b4;
  int Lname;
  byte longFname [12];
  undefined1 uStack_994;
  char *local_980;
  byte abin [4];
  undefined4 uStack_964;
  uint local_948;
  STrdHead trdHead;
  
  Lname = 0;
  EVar7 = TRD_FileNameToBytes(fhobname,longFname,&Lname);
  bVar3 = longFname[8];
  if (!addplace) {
    if (EVar7 == THREE_LETTER_EXTENSION) {
      WarningById(W_TRD_EXT_3,fhobname,W_PASS3);
      if (bVar3 == 'B') {
        WarningById(W_TRD_EXT_B,fhobname,W_PASS3);
        Lname = 9;
      }
    }
    else if (EVar7 == INVALID_EXTENSION) {
      WarningById(W_TRD_EXT_INVALID,fhobname,W_PASS3);
    }
  }
  if ((-1 < autostart) && (9999 < (uint)autostart || bVar3 != 'B')) {
    Warning("zx.trdimage_add_file: autostart value is BASIC program line number (0..9999) (in lua use -1 otherwise)."
            ,(char *)0x0,W_PASS3);
    autostart = 0xffffffff;
  }
  if (lengthMinusVars != -1) {
    if (bVar3 != 'B') {
      pcVar19 = "zx.trdimage_add_file: length without variables is for BASIC files only.";
      goto LAB_001182f2;
    }
    if (lengthMinusVars < 0 || length < lengthMinusVars) {
      pcVar19 = "zx.trdimage_add_file: length without variables is not in <0..length> range.";
      goto LAB_001182f2;
    }
  }
  if (DeviceID == (char *)0x0) {
    pcVar19 = "zx.trdimage_add_file: this function available only in real device emulation mode.";
LAB_001182f2:
    Error(pcVar19,(char *)0x0,PASS3);
    return false;
  }
  if (0xffff < (uint)start) {
    pcVar19 = "zx.trdimage_add_file: start address must be in 0000..FFFF range";
LAB_0011852c:
    Error(pcVar19,bp,PASS3);
    return false;
  }
  if (length - 0xff01U < 0xffff0100) {
    pcVar19 = "zx.trdimage_add_file: length must be in 0001..FF00 range";
    goto LAB_0011852c;
  }
  if (0x10000 < (uint)(start + length)) {
    pcVar19 = "zx.trdimage_add_file: provided start+length will run out of device memory";
    goto LAB_0011852c;
  }
  uVar13 = length + (~autostart >> 0x1f) * -4 + 0xff;
  uVar14 = uVar13 >> 8;
  longFname[0xb] = (byte)length;
  uStack_994 = (undefined1)((uint)length >> 8);
  cVar12 = (char)(uVar13 >> 8);
  if (bVar3 == 'B') {
    longFname._9_2_ = (short)length;
    if (lengthMinusVars != -1) {
      longFname[0xb] = (byte)lengthMinusVars;
      uStack_994 = (undefined1)((uint)lengthMinusVars >> 8);
    }
  }
  else if (Lname < 10) {
    longFname._9_2_ = (short)start;
  }
  if (cVar12 == '\0') {
    pcVar19 = "zx.trdimage_add_file: sector length over 0xFF max";
    goto LAB_0011852c;
  }
  __stream = (FILE *)SJ_fopen(fname,"r+b");
  if (__stream == (FILE *)0x0) {
    ReturnWithError("Error opening file",fname,(FILE *)0x0);
    return false;
  }
  memset(&trdHead.info,0,0xe2);
  trdHead.info.freeTrack = '\x01';
  trdHead.info.diskType = '\x16';
  trdHead.info.numOfFiles = '\0';
  trdHead.info.numOfFreeSectors = 0x9f0;
  trdHead.info.trDosId = '\x10';
  trdHead.info._unused2[0] = '\0';
  trdHead.info._unused2[1] = '\0';
  builtin_memcpy(trdHead.info.password,"         ",9);
  trdHead.info._unused3[0] = '\0';
  trdHead.info.numOfDeleted = '\0';
  builtin_memcpy(trdHead.info.label,"        ",8);
  trdHead.info._unused4[2] = '\0';
  trdHead.info._unused4[0] = '\0';
  trdHead.info._unused4[1] = '\0';
  this = &trdHead;
  bVar6 = STrdHead::readFromFile(this,(FILE *)__stream);
  if (!bVar6) {
    pcVar19 = "TRD image read error";
    goto LAB_0011870b;
  }
  sVar15 = (size_t)Lname;
  uVar13 = 0x80;
  local_9b4 = trdHead.info.numOfDeleted;
  lVar21 = 0;
  for (; (pcVar19 = W_TRD_DUPLICATE, lVar21 != 0x80 && (this->catalog[0].filename[0] != '\0'));
      this = (STrdHead *)(this->catalog + 1)) {
    iVar8 = bcmp(this,longFname,sVar15);
    if (iVar8 == 0) {
      if (((addplace) || (replace)) && (uVar13 != 0x80)) {
        trdHead.catalog[uVar13].filename[0] = '\x01';
        local_9b4 = local_9b4 + '\x01';
        trdHead.info.numOfDeleted = local_9b4;
      }
      uVar13 = (uint)lVar21;
    }
    lVar21 = lVar21 + 1;
  }
  if (addplace) {
    if (uVar13 == 0x80) {
      pcVar19 = "TRD image does not have a specified file to add data";
      goto LAB_0011870b;
    }
  }
  else {
    if (replace) {
      if (uVar13 != 0x80) {
        if (uVar13 + 1 == (uint)trdHead.info.numOfFiles) {
          bVar1 = trdHead.catalog[uVar13].sectorLength;
          bVar2 = trdHead.catalog[uVar13].startSector;
          uVar18 = (uint)bVar2 + (uint)bVar1;
          if ((uVar18 & 0xf) == (uint)trdHead.info.freeSector) {
            bVar3 = trdHead.catalog[uVar13].startTrack;
            if ((byte)((char)(uVar18 >> 4) + bVar3) == trdHead.info.freeTrack) {
              trdHead.info.freeTrack = bVar3;
              trdHead.info.numOfFreeSectors = trdHead.info.numOfFreeSectors + bVar1;
              trdHead.info.numOfFiles = trdHead.info.numOfFiles + 0xff;
              trdHead.catalog[uVar13].filename[0] = '\0';
              trdHead.info.freeSector = bVar2;
              goto LAB_0011869c;
            }
          }
          pcVar19 = "TRD free sector was not connected to last file";
          goto LAB_0011870b;
        }
        trdHead.catalog[uVar13].filename[0] = '\x01';
        trdHead.info.numOfDeleted = local_9b4 + '\x01';
      }
    }
    else if (uVar13 != 0x80) {
      std::filesystem::__cxx11::path::string((string *)abin,fname);
      WarningById(pcVar19,_abin,W_PASS3);
      std::__cxx11::string::~string((string *)abin);
    }
LAB_0011869c:
    if (trdHead.info.numOfFiles == 0x80) {
      pcVar19 = "TRD image is full of files";
      goto LAB_0011870b;
    }
    uVar13 = (uint)trdHead.info.numOfFiles;
  }
  uVar20 = (ulong)uVar13;
  __s1 = trdHead.catalog + uVar20;
  iVar8 = bcmp(__s1,longFname,sVar15);
  if (__s1->filename[0] == '\0' || iVar8 == 0) {
    uVar13 = uVar14 & 0xff;
    if (trdHead.info.numOfFreeSectors < (ushort)uVar13) {
      pcVar19 = "TRD image has not enough free space";
    }
    else {
      if (addplace) {
        bVar1 = trdHead.catalog[uVar20].sectorLength;
        uVar18 = (uint)bVar1;
        if (0xff < (uVar14 & 0xff) + (uint)bVar1) {
          pcVar19 = "zx.trdimage_add_file: new sector length over 0xFF max";
          goto LAB_0011870b;
        }
        trdHead.catalog[uVar20].sectorLength = (byte)(bVar1 + uVar14);
        bVar2 = trdHead.catalog[uVar20].startSector;
        lVar21 = (ulong)trdHead.catalog[uVar20].startTrack * 0x1000;
        uVar10 = (ulong)bVar2 * 0x100 + lVar21;
        __off = (ulong)bVar1 * 0x100 + uVar10;
        uVar16 = (ulong)trdHead.info.freeSector * 0x100 + (ulong)trdHead.info.freeTrack * 0x1000;
        uVar17 = uVar16 - __off;
        if (__off <= uVar16 && uVar17 != 0) {
          _abin = (pointer)operator_new__(uVar17);
          iVar9 = fseek(__stream,__off,0);
          local_980 = "TRD image has wrong format";
          if (iVar9 != 0) {
LAB_00118a6a:
            ReturnWithError(local_980,fname,(FILE *)__stream);
LAB_00118a7c:
            std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                      ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)abin);
            return false;
          }
          sVar15 = fread(_abin,1,uVar17,__stream);
          if (uVar17 != sVar15) {
            local_980 = "TRD read error";
            goto LAB_00118a6a;
          }
          iVar9 = fseek(__stream,(ulong)(((bVar1 + uVar14 & 0xff) + (uint)bVar2) * 0x100) + lVar21,0
                       );
          if (iVar9 != 0) goto LAB_00118a6a;
          sVar15 = fwrite(_abin,1,uVar17,__stream);
          if (uVar17 != sVar15) {
            local_980 = "TRD write error";
            goto LAB_00118a6a;
          }
          uVar16 = 0;
          std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
                    ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)abin,
                     (pointer)0x0);
          for (pbVar11 = &trdHead.catalog[0].startTrack;
              (uVar16 != 0x80 && (((STrdFile *)(pbVar11 + -0xf))->filename[0] != 0));
              pbVar11 = pbVar11 + 0x10) {
            if (uVar20 != uVar16) {
              bVar2 = pbVar11[-1];
              uVar17 = (ulong)bVar2 * 0x100 + (ulong)*pbVar11 * 0x1000;
              if (uVar20 <= uVar16 == uVar17 < uVar10) {
                ReturnWithError("TRD inconsistent catalog data",fname,(FILE *)__stream);
                goto LAB_00118a7c;
              }
              local_948 = (uint)uVar10;
              if (local_948 <= (uint)uVar17) {
                *pbVar11 = (char)(bVar2 + uVar13 >> 4) + *pbVar11;
                pbVar11[-1] = bVar2 + cVar12 & 0xf;
              }
            }
            uVar16 = uVar16 + 1;
          }
          std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                    ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)abin);
          uVar18 = (uint)bVar1;
        }
      }
      else {
        if (iVar8 == 0) {
          bVar3 = trdHead.catalog[uVar20].startSector;
          pbVar11 = &trdHead.catalog[uVar20].startTrack;
        }
        else {
          pbVar11 = &trdHead.info.freeTrack;
          bVar3 = trdHead.info.freeSector;
        }
        bVar4 = *pbVar11;
        *(undefined8 *)__s1->filename = longFname._0_8_;
        *(uint *)&trdHead.catalog[uVar20].ext =
             CONCAT13(longFname[0xb],CONCAT21(longFname._9_2_,longFname[8]));
        *(ushort *)((long)&trdHead.catalog[uVar20].length + 1) = CONCAT11(cVar12,uStack_994);
        trdHead.catalog[uVar20].startSector = bVar3;
        trdHead.catalog[uVar20].startTrack = bVar4;
        uVar18 = 0;
      }
      iVar9 = fseek(__stream,(ulong)(uVar18 << 8) +
                             (ulong)trdHead.catalog[uVar20].startTrack * 0x1000 +
                             (ulong)trdHead.catalog[uVar20].startSector * 0x100,0);
      if (iVar9 == 0) {
        iVar9 = SaveRAM((FILE *)__stream,start,length);
        _Var5._M_p = _abin;
        if (iVar9 == 0) {
          pcVar19 = "TRD write device RAM error";
        }
        else {
          if (-1 < autostart && !addplace) {
            abin[2] = (byte)autostart;
            abin[0] = 0x80;
            abin[1] = 0xaa;
            uStack_964 = SUB84(_Var5._M_p,4);
            abin[3] = (byte)((uint)autostart >> 8);
            sVar15 = fwrite(abin,1,4,__stream);
            if (sVar15 != 4) {
              pcVar19 = "Write error";
              goto LAB_0011870b;
            }
          }
          trdHead.info.freeTrack =
               trdHead.info.freeTrack + (char)(trdHead.info.freeSector + uVar13 >> 4);
          trdHead.info.numOfFreeSectors = trdHead.info.numOfFreeSectors - (ushort)uVar13;
          trdHead.info.freeSector = trdHead.info.freeSector + cVar12 & 0xf;
          if (iVar8 != 0) {
            trdHead.info.numOfFiles = trdHead.info.numOfFiles + '\x01';
          }
          iVar8 = fseek(__stream,0,0);
          if (iVar8 == 0) {
            bVar6 = STrdHead::writeToFile(&trdHead,(FILE *)__stream);
            if (bVar6) {
              fclose(__stream);
              return true;
            }
            pcVar19 = "TRD write error";
          }
          else {
            pcVar19 = "TRD image has wrong format";
          }
        }
      }
      else {
        pcVar19 = "TRD image has wrong format";
      }
    }
  }
  else {
    pcVar19 = "TRD inconsistent catalog data";
  }
LAB_0011870b:
  ReturnWithError(pcVar19,fname,(FILE *)__stream);
  return false;
}

Assistant:

bool TRD_AddFile(const std::filesystem::path & fname, const char* fhobname, int start, int length, int autostart, bool replace, bool addplace, int lengthMinusVars) {
	// do some preliminary checks with file name and autostart - prepare final catalog entry data
	union {
		STrdFile trdf;			// structure to hold future form of catalog record about new file
		byte longFname[12];		// 12 byte access for TRD_FileNameToBytes (to avoid LGTM alert)
	};
	int Lname = 0;
	// this will overwrite also first byte of "trd.length" (12 bytes are affected, not just 11)
	const ETrdFileName nameWarning = TRD_FileNameToBytes(fhobname, longFname, Lname);
	const bool isExtensionB = ('B' == trdf.ext);
	if (!addplace) {
		if (INVALID_EXTENSION == nameWarning) {
			WarningById(W_TRD_EXT_INVALID, fhobname);
		}
		if (THREE_LETTER_EXTENSION == nameWarning) {
			WarningById(W_TRD_EXT_3, fhobname);
			if (isExtensionB) {
				WarningById(W_TRD_EXT_B, fhobname);
				Lname = STrdFile::NAME_FULL_SZ;
			}
		}
	}
	if (0 <= autostart && (!isExtensionB || 9999 < autostart)) {
		Warning("zx.trdimage_add_file: autostart value is BASIC program line number (0..9999) (in lua use -1 otherwise).");
		autostart = -1;
	}
	if (-1 != lengthMinusVars) {
		if (!isExtensionB) {
			Error("zx.trdimage_add_file: length without variables is for BASIC files only.");
			return 0;
		} else if (lengthMinusVars < 0 || length < lengthMinusVars) {
			Error("zx.trdimage_add_file: length without variables is not in <0..length> range.");
			return 0;
		}
	}

	// more validations - for Lua (or SAVETRD letting wrong values go through)
	if (!DeviceID) {
		Error("zx.trdimage_add_file: this function available only in real device emulation mode.");
		return 0;
	}
	if (start < 0 || 0xFFFF < start) {
		Error("zx.trdimage_add_file: start address must be in 0000..FFFF range", bp, PASS3);
		return 0;
	}
	if (length <= 0 || 0xFF00 < length) {
		// zero length not allowed any more, because TRD docs on internet are imprecise
		// and I'm not sure what is the correct way of saving zero length file => error
		Error("zx.trdimage_add_file: length must be in 0001..FF00 range", bp, PASS3);
		return 0;
	}
	if (0x10000 < start+length) {
		Error("zx.trdimage_add_file: provided start+length will run out of device memory", bp, PASS3);
		return 0;
	}
	trdf.length = word(length);
	trdf.sectorLength = byte((length + 255 + (0 <= autostart ? 4 : 0))>>8);
	if (isExtensionB) {
		trdf.addressLo = byte(length);
		trdf.addressHi = byte(length>>8);
		if (-1 != lengthMinusVars) trdf.length = word(lengthMinusVars);
	} else {
		if (Lname <= int(STrdFile::NAME_FULL_SZ)) {
			trdf.addressLo = byte(start);	// single letter extension => "start" field is used for start value
			trdf.addressHi = byte(start>>8);
		}
	}
	if (0 == trdf.sectorLength) {	// can overflow only when 0xFF00 length with autostart => 0
		Error("zx.trdimage_add_file: sector length over 0xFF max", bp, PASS3);
		return 0;
	}

	// read 9 sectors of disk into "trdHead" (contains root directory catalog and disk info data)
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "r+b")) return ReturnWithError("Error opening file", fname, ff);
	STrdHead trdHead;
	if (!trdHead.readFromFile(ff)) {
		return ReturnWithError("TRD image read error", fname, ff);
	}

	// check if the requested file is already on the disk
	// in "add" or "replace" mode also delete all extra ones with the same name, keeping only last
	unsigned fileIndex = STrdHead::NUM_OF_FILES_MAX;
	for (unsigned fatIndex = 0; fatIndex < STrdHead::NUM_OF_FILES_MAX; ++fatIndex) {
		auto & entry = trdHead.catalog[fatIndex];
		if (0 == entry.filename[0]) break;		// beyond last FAT record, finish the loop
		if (memcmp(entry.filename, trdf.filename, Lname)) continue;	// different file name -> continue
		// in "add" or "replace" mode delete the previous incarnations of this filename (returns only last one)
		if ((addplace || replace) && STrdHead::NUM_OF_FILES_MAX != fileIndex) {
			// delete the previously found file (it stays in catalog as deleted file)
			trdHead.catalog[fileIndex].filename[0] = 1;
			++trdHead.info.numOfDeleted;
		}
		// remember the position of last entry with the requested file name
		fileIndex = fatIndex;
	}

	// check and process [un]found file based on the requested mode
	if (addplace) {
		// in "add" mode the file must already exist
		if (STrdHead::NUM_OF_FILES_MAX == fileIndex) {
			return ReturnWithError("TRD image does not have a specified file to add data", fname, ff);
		}
	} else if (replace) {
		// in "replace" mode delete also the last occurance
		if (STrdHead::NUM_OF_FILES_MAX != fileIndex) {
			auto & entry = trdHead.catalog[fileIndex];
			if (fileIndex + 1 == trdHead.info.numOfFiles) {		// if last file in the catalog
				// It's last file of catalog, erase it as if it was not on disc at all
				// verify if the free space starts just where last file ends (integrity of TRD image)
				const byte nextTrack = ((entry.sectorLength + entry.startSector) >> 4) + entry.startTrack;
				const byte nextSector = (entry.sectorLength + entry.startSector) & 0x0F;
				// if file connects to first free sector, salvage the space back
				if (nextSector != trdHead.info.freeSector || nextTrack != trdHead.info.freeTrack) {
					return ReturnWithError("TRD free sector was not connected to last file", fname, ff);
				}
				// return the sectors used by file back to "free sectors" pool
				trdHead.info.freeSector = entry.startSector;
				trdHead.info.freeTrack = entry.startTrack;
				trdHead.info.numOfFreeSectors += entry.sectorLength;
				// delete the file (wipe catalog entry completely as if it was not written)
				--trdHead.info.numOfFiles;
				entry.filename[0] = 0;
			} else {
				// delete the file (but it stays in catalog as deleted file) (and new file will be added)
				entry.filename[0] = 1;
				++trdHead.info.numOfDeleted;
			}
		}
		fileIndex = trdHead.info.numOfFiles;
	} else {
		// in "normal" mode warn when file already exists
		if (STrdHead::NUM_OF_FILES_MAX != fileIndex) {
			// to keep legacy behaviour of older sjasmplus versions, this is just warning
			// and the same file will be added to end of directory any way
			WarningById(W_TRD_DUPLICATE, fname.string().c_str());
		}
		fileIndex = trdHead.info.numOfFiles;
	}

	// fileIndex should point to valid record in catalog, verify the status and free space
	if (STrdHead::NUM_OF_FILES_MAX == fileIndex) {
		return ReturnWithError("TRD image is full of files", fname, ff);
	}
	auto & target = trdHead.catalog[fileIndex];
	const bool isNewTarget = !!memcmp(target.filename, trdf.filename, Lname);
	if (0 != target.filename[0] && isNewTarget) {
		// the target entry must have zero as first char or must have requested name
		return ReturnWithError("TRD inconsistent catalog data", fname, ff);
	}
	if (trdHead.info.numOfFreeSectors < trdf.sectorLength) {
		return ReturnWithError("TRD image has not enough free space", fname, ff);
	}
	const int keepSectors = addplace ? target.sectorLength : 0;
	if (0xFF < keepSectors + int(trdf.sectorLength)) {
		return ReturnWithError("zx.trdimage_add_file: new sector length over 0xFF max",  fname, ff);
	}

	// set the target record in catalog
	if (addplace) {
		// just add sector length, keep target.length at old value (no idea why, ask Dart Alver)
		target.sectorLength += trdf.sectorLength;
		// keeps basically EVERYTHING in the old catalog entry as it was, only sector length is raised
	} else {
		// finalize the prepared catalog entry record with starting position
		if (isNewTarget) {
			trdf.startSector = trdHead.info.freeSector;
			trdf.startTrack = trdHead.info.freeTrack;
		} else {
			trdf.startSector = target.startSector;
			trdf.startTrack = target.startTrack;
		}
		// write it to the actual catalog
		target = trdf;
	}

	// in "add" mode shift all data sectors to make room for the newly added ones
	if (addplace) {
		const long targetPos = STrdDisc::fileOffset(target.startTrack, target.startSector);
		const long oldTargetEndPos = targetPos + (keepSectors * STrdDisc::SECTOR_SZ);
		const long newTargetEndPos = targetPos + (target.sectorLength * STrdDisc::SECTOR_SZ);
		const long freePos = STrdDisc::fileOffset(trdHead.info.freeTrack, trdHead.info.freeSector);
		if (oldTargetEndPos < freePos) {	// some data after old file -> shift them a bit
			// first move the data inside the TRD image
			size_t dataToMoveLength = freePos - oldTargetEndPos;
			std::unique_ptr<byte[]> dataToMove(new byte[dataToMoveLength]);
			if (nullptr == dataToMove.get()) ErrorOOM();
			if (fseek(ff, oldTargetEndPos, SEEK_SET)) {
				return ReturnWithError("TRD image has wrong format", fname, ff);
			}
			if (dataToMoveLength != fread(dataToMove.get(), 1, dataToMoveLength, ff)) {
				return ReturnWithError("TRD read error", fname, ff);
			}
			if (fseek(ff, newTargetEndPos, SEEK_SET)) {
				return ReturnWithError("TRD image has wrong format", fname, ff);
			}
			// first modification of the provided TRD file (since here, if something fails, the file is damaged)
			if (dataToMoveLength != fwrite(dataToMove.get(), 1, dataToMoveLength, ff)) {
				return ReturnWithError("TRD write error", fname, ff);
			}
			dataToMove.reset();		// delete allocated memory already here
			// adjust all catalog entries which got the content sectors shifted
			for (unsigned entryIndex = 0; entryIndex < STrdHead::NUM_OF_FILES_MAX; ++entryIndex) {
				auto & entry = trdHead.catalog[entryIndex];
				if (0 == entry.filename[0]) break;		// beyond last FAT record, finish the loop
				if (entryIndex == fileIndex) continue;	// ignore the "target" itself
				// check if all files in catalog after target are also affected by content shift and vice versa
				const long entryPos = STrdDisc::fileOffset(entry.startTrack, entry.startSector);
				if ((entryIndex < fileIndex) != (entryPos < targetPos)) {
					return ReturnWithError("TRD inconsistent catalog data", fname, ff);
				}
				if (entryPos < targetPos) continue;		// this one is ahead of the target file
				// the file got shifted content => update the catalog entry
				entry.startTrack += (trdf.sectorLength + entry.startSector) >> 4;
				entry.startSector = (trdf.sectorLength + entry.startSector) & 0x0F;
			}
		} // END if (oldTargetEndPos < freePos)
	} // END if (addplace)

	// save the new data into the TRD (content sectors)
	long writePos = STrdDisc::fileOffset(target.startTrack, target.startSector);
	writePos += keepSectors * STrdDisc::SECTOR_SZ;
	if (fseek(ff, writePos, SEEK_SET)) {
		return ReturnWithError("TRD image has wrong format", fname, ff);
	}
	if (!SaveRAM(ff, start, length)) {
		return ReturnWithError("TRD write device RAM error", fname, ff);
	}
	if (!addplace && 0 <= autostart) {
		byte abin[] {0x80, 0xAA, static_cast<byte>(autostart), static_cast<byte>(autostart>>8)};
		if (4 != fwrite(abin, 1, 4, ff)) {
			return ReturnWithError("Write error", fname, ff);
		}
	}

	// update next free sector/track position
	trdHead.info.freeTrack += (trdf.sectorLength + trdHead.info.freeSector) >> 4;
	trdHead.info.freeSector = (trdf.sectorLength + trdHead.info.freeSector) & 0x0F;
	// update remaining free sectors
	trdHead.info.numOfFreeSectors -= trdf.sectorLength;
	if (isNewTarget) ++trdHead.info.numOfFiles;

	// update whole catalog and disc info with modified data
	if (fseek(ff, 0, SEEK_SET)) {
		return ReturnWithError("TRD image has wrong format", fname, ff);
	}
	if (!trdHead.writeToFile(ff)) {
		return ReturnWithError("TRD write error", fname, ff);
	}

	fclose(ff);
	return 1;
}